

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

size_t write_vars(MIR_context_t ctx,writer_func_t writer,MIR_func_t func,VARR_MIR_var_t *vars,
                 size_t start,size_t vars_num,char *prefix)

{
  MIR_reg_t reg;
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  MIR_var_t var;
  
  if (vars == (VARR_MIR_var_t *)0x0 || vars_num == 0) {
    sVar1 = 0;
  }
  else {
    bVar5 = false;
    lVar4 = 0;
    while (bVar6 = vars_num != 0, vars_num = vars_num - 1, bVar6) {
      VARR_MIR_var_tget(&var,vars,start);
      if (!bVar5) {
        sVar1 = write_name(ctx,writer,prefix);
        lVar4 = lVar4 + sVar1;
      }
      sVar1 = write_type(ctx,writer,var.type);
      pcVar3 = var.name;
      sVar2 = write_name(ctx,writer,var.name);
      lVar4 = sVar2 + sVar1 + lVar4;
      reg = MIR_reg(ctx,pcVar3,func);
      pcVar3 = MIR_reg_hard_reg_name(ctx,reg,func);
      if (pcVar3 != (char *)0x0) {
        sVar1 = write_name(ctx,writer,pcVar3);
        lVar4 = lVar4 + sVar1;
      }
      bVar5 = true;
      start = start + 1;
    }
    sVar1 = put_byte(ctx,writer,0x3d);
    sVar1 = sVar1 + lVar4;
  }
  return sVar1;
}

Assistant:

static size_t write_vars (MIR_context_t ctx, writer_func_t writer, MIR_func_t func,
                          VARR (MIR_var_t) * vars, size_t start, size_t vars_num,
                          const char *prefix) {
  if (vars_num == 0 || vars == NULL) return 0;
  size_t len = 0;
  int first_p = TRUE;
  for (size_t i = 0; i < vars_num; i++) {
    MIR_var_t var = VARR_GET (MIR_var_t, vars, i + start);
    if (first_p) len += write_name (ctx, writer, prefix);
    first_p = FALSE;
    len += write_type (ctx, writer, var.type);
    len += write_name (ctx, writer, var.name);
    MIR_reg_t reg = MIR_reg (ctx, var.name, func);
    const char *hard_reg_name = MIR_reg_hard_reg_name (ctx, reg, func);
    if (hard_reg_name != NULL) len += write_name (ctx, writer, hard_reg_name);
  }
  len += put_byte (ctx, writer, TAG_EOI);
  return len;
}